

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

void __thiscall moira::Moira::setNumberFormat(Moira *this,DasmStyle *style,DasmNumberFormat *value)

{
  bool bVar1;
  undefined5 uVar2;
  bool bVar3;
  runtime_error *prVar4;
  anon_class_1_0_00000001 local_22;
  anon_class_1_0_00000001 local_21;
  anon_class_1_0_00000001 validRadix;
  DasmNumberFormat *pDStack_20;
  anon_class_1_0_00000001 validPrefix;
  DasmNumberFormat *value_local;
  DasmStyle *style_local;
  Moira *this_local;
  
  pDStack_20 = value;
  bVar3 = setNumberFormat::anon_class_1_0_00000001::operator()(&local_21,*value);
  if (!bVar3) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"prefix must not be NULL");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar3 = setNumberFormat::anon_class_1_0_00000001::operator()(&local_22,*pDStack_20);
  if (!bVar3) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"radix must be 10 or 16");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (style->numberFormat).prefix = pDStack_20->prefix;
  bVar3 = pDStack_20->upperCase;
  bVar1 = pDStack_20->plainZero;
  uVar2 = *(undefined5 *)&pDStack_20->field_0xb;
  (style->numberFormat).radix = pDStack_20->radix;
  (style->numberFormat).upperCase = bVar3;
  (style->numberFormat).plainZero = bVar1;
  *(undefined5 *)&(style->numberFormat).field_0xb = uVar2;
  return;
}

Assistant:

void
Moira::setNumberFormat(DasmStyle &style, const DasmNumberFormat &value)
{
    auto validPrefix = [&](DasmNumberFormat fmt) { return fmt.prefix != nullptr; };
    auto validRadix = [&](DasmNumberFormat fmt) { return fmt.radix == 10 || fmt.radix == 16; };

    if (!validPrefix(value)) {
        throw std::runtime_error("prefix must not be NULL");
    }
    if (!validRadix(value)) {
        throw std::runtime_error("radix must be 10 or 16");
    }

    style.numberFormat = value;
}